

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O3

shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 __thiscall
mini_bus::MiniBusClient::send_event_abi_cxx11_
          (MiniBusClient *this,string_view command,string_view payload,uint32_t *rid)

{
  undefined8 uVar1;
  MiniBusClient *__args_1;
  error_category *peVar2;
  result_type rVar3;
  ulong uVar4;
  long lVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t sVar6;
  long lVar7;
  char cVar8;
  char *pcVar9;
  bool bVar10;
  shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sVar11;
  MiniBusEncoder encoder;
  shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *tok;
  unique_lock<std::mutex> lock;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  MiniBusClient *local_b8;
  uint32_t *local_b0;
  size_t local_a8;
  int local_a0;
  uint uStack_9c;
  error_category *local_98;
  unique_lock<std::mutex> local_90;
  system_error local_80;
  undefined1 *local_40;
  undefined1 *local_38;
  
  pcVar9 = payload._M_str;
  local_a8 = payload._M_len;
  sVar6 = command._M_len;
  local_90._M_device = (mutex_type *)(sVar6 + 0x13a8);
  local_90._M_owns = false;
  local_b8 = this;
  local_b0 = rid;
  std::unique_lock<std::mutex>::lock(&local_90);
  local_90._M_owns = true;
  while( true ) {
    rVar3 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)(sVar6 + 0x13a0),
                       (random_device *)(sVar6 + 0x18),(param_type *)(sVar6 + 0x13a0));
    lVar5 = *(long *)(sVar6 + 0x13e0);
    if (lVar5 == 0) break;
    uVar4 = (ulong)rVar3;
    lVar7 = sVar6 + 0x13d8;
    do {
      bVar10 = *(ulong *)(lVar5 + 0x20) < uVar4;
      if (!bVar10) {
        lVar7 = lVar5;
      }
      lVar5 = *(long *)(lVar5 + 0x10 + (ulong)bVar10 * 8);
    } while (lVar5 != 0);
    if ((lVar7 == sVar6 + 0x13d8) || (uVar4 < *(ulong *)(lVar7 + 0x20))) break;
  }
  *(result_type *)encoder.buffer._M_string_length = rVar3;
  local_d0 = (undefined1 *)0x0;
  local_c8 = 0;
  local_80._0_4_ = rVar3;
  local_d8 = &local_c8;
  std::__cxx11::string::append((char *)&local_d8,(ulong)&local_80);
  cVar8 = (char)&local_d8;
  std::__cxx11::string::push_back(cVar8);
  std::__cxx11::string::append((char *)&local_d8,local_a8);
  std::__cxx11::string::reserve((ulong)&local_d8);
  if ((char *)0x7f < pcVar9) {
    do {
      std::__cxx11::string::push_back(cVar8);
      bVar10 = (char *)0x3fff < pcVar9;
      pcVar9 = (char *)((ulong)pcVar9 >> 7);
    } while (bVar10);
  }
  std::__cxx11::string::push_back(cVar8);
  std::__cxx11::string::append((char *)&local_d8,(ulong)local_b0);
  local_40 = local_d0;
  if (local_d0 != (undefined1 *)0x0) {
    local_40 = local_d8;
  }
  local_80._0_8_ = &local_40;
  local_38 = local_d0;
  local_a0 = 0;
  uStack_9c = uStack_9c & 0xffffff00;
  local_98 = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
  ;
  boost::asio::detail::
  write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::const_buffer_const*,boost::asio::detail::transfer_all_t>
            (sVar6 + 0x1460);
  peVar2 = local_98;
  __args_1 = local_b8;
  if ((char)uStack_9c == '\x01') {
    uVar1._4_4_ = uStack_9c;
    uVar1._0_4_ = local_a0;
    std::runtime_error::runtime_error(&local_80.super_runtime_error,"write");
    local_80.m_what._M_dataplus._M_p = (pointer)&local_80.m_what.field_2;
    local_80._0_8_ = &PTR__system_error_0011cb80;
    local_80.m_error_code.cat_ = peVar2;
    local_80.m_what._M_string_length = 0;
    local_80.m_what.field_2._M_local_buf[0] = '\0';
    local_80.m_error_code._0_8_ = uVar1;
    boost::throw_exception<boost::system::system_error>(&local_80);
  }
  *(undefined8 *)local_b8 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::string>>,std::allocator<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::string>>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8->info,
             (SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              **)local_b8,
             (allocator<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_80);
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>,std::_Select1st<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
  ::
  _M_emplace_unique<unsigned_int&,std::shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::string>>>&>
            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>,std::_Select1st<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
              *)(sVar6 + 0x13d0),(uint *)encoder.buffer._M_string_length,
             (shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)__args_1);
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_90);
  sVar11.
  super___shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar11.
  super___shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)__args_1;
  return (shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )sVar11.
           super___shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline std::shared_ptr<SyncNotifyToken<std::optional<std::string>>>
  send_event(std::string_view command, std::string_view payload, uint32_t &rid) {
    std::unique_lock lock{mtx};
    rid = select_rid();
    MiniBusEncoder encoder;
    encoder.insert_rid(rid);
    encoder.insert_short_string(command);
    encoder.insert_long_string(payload);
    auto view = encoder.view();
    write(*socket, buffer(view), transfer_all());
    auto tok = std::make_shared<SyncNotifyToken<std::optional<std::string>>>();
    reqmap.emplace(rid, tok);
    return tok;
  }